

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triple_buffer.hpp
# Opt level: O0

int __thiscall TripleBuffer<Control>::swapBackIfReady(TripleBuffer<Control> *this)

{
  int iVar1;
  undefined1 local_20 [4];
  int r;
  unique_lock<std::mutex> ul;
  TripleBuffer<Control> *this_local;
  
  ul._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->m);
  if (0 < this->count) {
    swap(this,&this->back,&this->middle);
  }
  iVar1 = this->count;
  this->count = 0;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return iVar1;
}

Assistant:

int swapBackIfReady() {
    unique_lock<mutex> ul(m);
    if (count > 0) swap(back, middle);
    int r = count;
    count = 0;
    return r;
  }